

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O0

void __thiscall yactfr::internal::StrScanner::save(StrScanner *this)

{
  value_type local_28;
  StrScanner *local_10;
  StrScanner *this_local;
  
  local_28.at = this->_at;
  local_28.lineBegin = this->_lineBegin;
  local_28.nbLines = this->_nbLines;
  local_10 = this;
  std::
  vector<yactfr::internal::StrScanner::_tStackFrame,_std::allocator<yactfr::internal::StrScanner::_tStackFrame>_>
  ::push_back(&this->_stack,&local_28);
  return;
}

Assistant:

void save()
    {
        _stack.push_back({_at, _lineBegin, _nbLines});
    }